

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManPrintBoxInfoSorted(Au_Ntk_t *pNtk)

{
  Au_Man_t *pAVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  Au_Ntk_t *p_00;
  char *pcVar4;
  int local_2c;
  int i;
  Au_Ntk_t *pModel;
  Vec_Ptr_t *vModsNew;
  Vec_Ptr_t *vMods;
  Au_Ntk_t *pNtk_local;
  
  if (pNtk->pMan == (Au_Man_t *)0x0) {
    printf("There is no hierarchy information.\n");
  }
  else {
    pAVar1 = pNtk->pMan;
    (pAVar1->vNtks).nSize = (pAVar1->vNtks).nSize + -1;
    (pAVar1->vNtks).pArray = (pAVar1->vNtks).pArray + 1;
    p = Vec_PtrDup(&pAVar1->vNtks);
    (pAVar1->vNtks).pArray = (pAVar1->vNtks).pArray + -1;
    (pAVar1->vNtks).nSize = (pAVar1->vNtks).nSize + 1;
    Vec_PtrSort(p,Au_NtkCompareSign);
    for (local_2c = 1; iVar2 = Vec_PtrSize(p), local_2c < iVar2; local_2c = local_2c + 1) {
      p_00 = (Au_Ntk_t *)Vec_PtrEntry(p,local_2c);
      printf("MODULE  ");
      pcVar4 = Au_NtkName(p_00);
      printf("%-30s : ",pcVar4);
      uVar3 = Au_NtkPiNum(p_00);
      printf("PI=%6d ",(ulong)uVar3);
      uVar3 = Au_NtkPoNum(p_00);
      printf("PO=%6d ",(ulong)uVar3);
      uVar3 = Au_NtkBoxNum(p_00);
      printf("BB=%6d ",(ulong)uVar3);
      uVar3 = Au_NtkNodeNum(p_00);
      printf("ND=%6d ",(ulong)uVar3);
      printf("\n");
    }
    Vec_PtrFree(p);
  }
  return;
}

Assistant:

void Au_ManPrintBoxInfoSorted( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vModsNew;
    Au_Ntk_t * pModel;
    int i;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

    vMods->nSize--;
    vMods->pArray++;
    vModsNew = Vec_PtrDup( vMods );
    vMods->pArray--;
    vMods->nSize++;

    Vec_PtrSort( vModsNew, (int(*)())Au_NtkCompareSign );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vModsNew, pModel, i, 1 )
    {
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
        printf( "\n" );
    }
    Vec_PtrFree( vModsNew );
}